

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::AnalyzeDependencyForFile
               (FileDescriptor *file,
               set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *nodes_without_dependency,
               map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
               *deps,map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                     *dependency_count)

{
  int iVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_98;
  _Self local_68;
  _Self local_60;
  FileDescriptor *local_58;
  FileDescriptor *dependency_1;
  int i_1;
  FileDescriptor *local_38;
  FileDescriptor *dependency;
  int i;
  int count;
  map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
  *dependency_count_local;
  map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
  *deps_local;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *nodes_without_dependency_local;
  FileDescriptor *file_local;
  
  _i = dependency_count;
  dependency_count_local =
       (map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
        *)deps;
  deps_local = (map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                *)nodes_without_dependency;
  nodes_without_dependency_local =
       (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        *)file;
  dependency._4_4_ = FileDescriptor::dependency_count(file);
  dependency._0_4_ = 0;
  do {
    iVar1 = (int)dependency;
    iVar4 = FileDescriptor::dependency_count((FileDescriptor *)nodes_without_dependency_local);
    if (iVar4 <= iVar1) {
LAB_004c7552:
      iVar1 = dependency._4_4_;
      if (dependency._4_4_ == 0) {
        std::
        set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::insert((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)deps_local,(value_type *)&nodes_without_dependency_local);
      }
      else {
        pmVar6 = std::
                 map<const_google::protobuf::FileDescriptor_*,_int,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_int>_>_>
                 ::operator[](_i,(key_type *)&nodes_without_dependency_local);
        *pmVar6 = iVar1;
        for (dependency_1._4_4_ = 0; iVar1 = dependency_1._4_4_,
            iVar4 = FileDescriptor::dependency_count
                              ((FileDescriptor *)nodes_without_dependency_local), iVar1 < iVar4;
            dependency_1._4_4_ = dependency_1._4_4_ + 1) {
          local_58 = FileDescriptor::dependency
                               ((FileDescriptor *)nodes_without_dependency_local,dependency_1._4_4_)
          ;
          psVar5 = FileDescriptor::name_abi_cxx11_(local_58);
          _Var2 = std::operator==(psVar5,&kDescriptorFile_abi_cxx11_);
          if (!_Var2) {
            local_60._M_node =
                 (_Base_ptr)
                 std::
                 map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                 ::find((map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                         *)dependency_count_local,&local_58);
            local_68._M_node =
                 (_Base_ptr)
                 std::
                 map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                 ::end((map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                        *)dependency_count_local);
            bVar3 = std::operator==(&local_60,&local_68);
            if (bVar3) {
              local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
              local_98._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
              local_98._M_t._M_impl._0_8_ = 0;
              local_98._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_98._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              std::
              set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::set(&local_98);
              pmVar7 = std::
                       map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                       ::operator[]((map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                                     *)dependency_count_local,&local_58);
              std::
              set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator=(pmVar7,&local_98);
              std::
              set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::~set(&local_98);
            }
            pmVar7 = std::
                     map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                     ::operator[]((map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                                   *)dependency_count_local,&local_58);
            std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::insert(pmVar7,(value_type *)&nodes_without_dependency_local);
            AnalyzeDependencyForFile
                      (local_58,(set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                 *)deps_local,
                       (map<const_google::protobuf::FileDescriptor_*,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FileDescriptor_*const,_std::set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>_>_>
                        *)dependency_count_local,_i);
          }
        }
      }
      return;
    }
    local_38 = FileDescriptor::dependency
                         ((FileDescriptor *)nodes_without_dependency_local,(int)dependency);
    psVar5 = FileDescriptor::name_abi_cxx11_(local_38);
    _Var2 = std::operator==(psVar5,&kDescriptorFile_abi_cxx11_);
    if (_Var2) {
      dependency._4_4_ = dependency._4_4_ + -1;
      goto LAB_004c7552;
    }
    dependency._0_4_ = (int)dependency + 1;
  } while( true );
}

Assistant:

static void AnalyzeDependencyForFile(
    const FileDescriptor* file,
    std::set<const FileDescriptor*>* nodes_without_dependency,
    std::map<const FileDescriptor*, std::set<const FileDescriptor*>>* deps,
    std::map<const FileDescriptor*, int>* dependency_count) {
  int count = file->dependency_count();
  for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        count--;
        break;
      }
  }

  if (count == 0) {
    nodes_without_dependency->insert(file);
  } else {
    (*dependency_count)[file] = count;
    for (int i = 0; i < file->dependency_count(); i++) {
      const FileDescriptor* dependency = file->dependency(i);
      if (dependency->name() == kDescriptorFile) {
        continue;
      }
      if (deps->find(dependency) == deps->end()) {
        (*deps)[dependency] = std::set<const FileDescriptor*>();
      }
      (*deps)[dependency].insert(file);
      AnalyzeDependencyForFile(
          dependency, nodes_without_dependency, deps, dependency_count);
    }
  }
}